

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::addHangLimitSupport(TranslateToFuzzReader *this)

{
  size_t sVar1;
  char *pcVar2;
  Const *pCVar3;
  size_t *psVar4;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> glob;
  
  sVar1 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  pcVar2 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  pCVar3 = Builder::makeConst<int>(&this->builder,(this->fuzzParams->super_FuzzParams).HANG_LIMIT);
  psVar4 = (size_t *)operator_new(0x50);
  *psVar4 = 0;
  psVar4[1] = 0;
  psVar4[2] = 0;
  psVar4[3] = 0;
  psVar4[4] = 0;
  psVar4[5] = 0;
  psVar4[6] = 0;
  psVar4[7] = 0;
  psVar4[8] = 0;
  psVar4[9] = 0;
  *psVar4 = sVar1;
  psVar4[1] = (size_t)pcVar2;
  psVar4[7] = 2;
  psVar4[8] = (size_t)pCVar3;
  *(undefined1 *)(psVar4 + 9) = 1;
  ::wasm::Module::addGlobal((unique_ptr *)this->wasm);
  if (psVar4 != (size_t *)0x0) {
    operator_delete(psVar4,0x50);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addHangLimitSupport() {
  auto glob =
    builder.makeGlobal(HANG_LIMIT_GLOBAL,
                       Type::i32,
                       builder.makeConst(int32_t(fuzzParams->HANG_LIMIT)),
                       Builder::Mutable);
  wasm.addGlobal(std::move(glob));
}